

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_2::BufferBindingTestCase::test
          (BufferBindingTestCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  ResultCollector *pRVar1;
  deBool dVar2;
  Enum<int,_2UL> EVar3;
  GetNameFunc local_1c0;
  int local_1b8;
  string local_1b0;
  allocator<char> local_189;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  GLenum local_104;
  GetNameFunc p_Stack_100;
  deUint32 err_1;
  int local_f8;
  GetNameFunc local_f0;
  int local_e8;
  string local_e0;
  allocator<char> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  GLenum local_28;
  GLuint local_24;
  deUint32 err;
  GLuint bufferObject;
  ResultCollector *result_local;
  CallLogWrapper *gl_local;
  BufferBindingTestCase *this_local;
  
  _err = result;
  result_local = (ResultCollector *)gl;
  gl_local = (CallLogWrapper *)this;
  deqp::gls::StateQueryUtil::verifyStateInteger
            (result,gl,*(GLenum *)&(this->super_BindingTest).field_0x7c,0,
             (this->super_BindingTest).m_type);
  local_24 = 0;
  glu::CallLogWrapper::glGenBuffers((CallLogWrapper *)result_local,1,&local_24);
  do {
    local_28 = glu::CallLogWrapper::glGetError((CallLogWrapper *)result_local);
    pRVar1 = _err;
    if (local_28 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"Got Error ",&local_a9)
      ;
      EVar3 = glu::getErrorStr(local_28);
      p_Stack_100 = EVar3.m_getName;
      local_f8 = EVar3.m_value;
      local_f0 = p_Stack_100;
      local_e8 = local_f8;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_e0,&local_f0);
      std::operator+(&local_88,&local_a8,&local_e0);
      std::operator+(&local_68,&local_88,": ");
      std::operator+(&local_48,&local_68,"glGenBuffers");
      tcu::ResultCollector::fail(pRVar1,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator(&local_a9);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  glu::CallLogWrapper::glBindBuffer((CallLogWrapper *)result_local,this->m_bufferType,local_24);
  deqp::gls::StateQueryUtil::verifyStateInteger
            (_err,(CallLogWrapper *)result_local,*(GLenum *)&(this->super_BindingTest).field_0x7c,
             local_24,(this->super_BindingTest).m_type);
  glu::CallLogWrapper::glDeleteBuffers((CallLogWrapper *)result_local,1,&local_24);
  do {
    local_104 = glu::CallLogWrapper::glGetError((CallLogWrapper *)result_local);
    pRVar1 = _err;
    if (local_104 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_188,"Got Error ",&local_189);
      EVar3 = glu::getErrorStr(local_104);
      local_1c0 = EVar3.m_getName;
      local_1b8 = EVar3.m_value;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1b0,&local_1c0);
      std::operator+(&local_168,&local_188,&local_1b0);
      std::operator+(&local_148,&local_168,": ");
      std::operator+(&local_128,&local_148,"glDeleteBuffers");
      tcu::ResultCollector::fail(pRVar1,&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator(&local_189);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  deqp::gls::StateQueryUtil::verifyStateInteger
            (_err,(CallLogWrapper *)result_local,*(GLenum *)&(this->super_BindingTest).field_0x7c,0,
             (this->super_BindingTest).m_type);
  return;
}

Assistant:

void test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
	{
		verifyStateInteger(result, gl, m_bufferBindingName, 0, m_type);

		GLuint bufferObject = 0;
		gl.glGenBuffers(1, &bufferObject);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGenBuffers");

		gl.glBindBuffer(m_bufferType, bufferObject);
		verifyStateInteger(result, gl, m_bufferBindingName, bufferObject, m_type);

		gl.glDeleteBuffers(1, &bufferObject);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glDeleteBuffers");

		verifyStateInteger(result, gl, m_bufferBindingName, 0, m_type);
	}